

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

void __thiscall
glslang::TInputScanner::consumeWhitespaceComment(TInputScanner *this,bool *foundNonSpaceTab)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  
  while( true ) {
    consumeWhiteSpace(this,foundNonSpaceTab);
    lVar2 = (long)this->currentSource;
    if (this->numSources <= this->currentSource) {
      this->endOfFileReached = true;
      return;
    }
    uVar3 = this->currentChar;
    while (this->lengths[lVar2] <= uVar3) {
      lVar2 = lVar2 + 1;
      uVar3 = 0;
      if (this->numSources == lVar2) {
        return;
      }
    }
    if (this->sources[lVar2][uVar3] != '/') break;
    *foundNonSpaceTab = true;
    bVar1 = consumeComment(this);
    if (!bVar1) {
      return;
    }
  }
  return;
}

Assistant:

void TInputScanner::consumeWhitespaceComment(bool& foundNonSpaceTab)
{
    do {
        consumeWhiteSpace(foundNonSpaceTab);

        // if not starting a comment now, then done
        int c = peek();
        if (c != '/' || c == EndOfInput)
            return;

        // skip potential comment
        foundNonSpaceTab = true;
        if (! consumeComment())
            return;

    } while (true);
}